

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  MultiplyOperator *pMVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong right;
  ulong uVar6;
  int64_t *piVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  interval_t iVar13;
  interval_t left;
  interval_t left_00;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pMVar2 = *(MultiplyOperator **)rdata;
      iVar3 = rdata->micros;
      iVar10 = 0;
      piVar7 = (int64_t *)count;
      local_68 = &result_data->micros;
      do {
        iVar13.micros = ldata[iVar10];
        iVar13._0_8_ = iVar3;
        iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                           (pMVar2,iVar13,(int64_t)piVar7);
        ((interval_t *)(local_68 + -1))->months = (int)iVar13._0_8_;
        ((interval_t *)(local_68 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
        *local_68 = iVar13.micros;
        iVar10 = iVar10 + 1;
        piVar7 = local_68 + 2;
        local_68 = piVar7;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = count + 0x3f >> 6;
    uVar11 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
LAB_010b50ac:
        uVar4 = uVar11;
        if (uVar11 < uVar12) {
          pMVar2 = *(MultiplyOperator **)rdata;
          iVar3 = rdata->micros;
          piVar7 = &result_data[uVar11].micros;
          uVar6 = uVar5;
          do {
            left_00.micros = ldata[uVar11];
            left_00._0_8_ = iVar3;
            iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                               (pMVar2,left_00,uVar6);
            ((interval_t *)(piVar7 + -1))->months = (int)iVar13._0_8_;
            ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
            *piVar7 = iVar13.micros;
            uVar11 = uVar11 + 1;
            piVar7 = piVar7 + 2;
            uVar4 = uVar12;
          } while (uVar12 != uVar11);
        }
      }
      else {
        uVar6 = puVar1[uVar8];
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        uVar4 = uVar12;
        if (uVar6 != 0) {
          if (uVar6 == 0xffffffffffffffff) goto LAB_010b50ac;
          uVar4 = uVar11;
          if (uVar11 < uVar12) {
            piVar7 = &result_data[uVar11].micros;
            uVar9 = 0;
            right = uVar5;
            do {
              if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
                left.micros = ldata[uVar11 + uVar9];
                left._0_8_ = rdata->micros;
                iVar13 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                   (*(MultiplyOperator **)rdata,left,right);
                ((interval_t *)(piVar7 + -1))->months = (int)iVar13._0_8_;
                ((interval_t *)(piVar7 + -1))->days = (int)((ulong)iVar13._0_8_ >> 0x20);
                *piVar7 = iVar13.micros;
              }
              uVar9 = uVar9 + 1;
              piVar7 = piVar7 + 2;
              uVar4 = uVar12;
            } while (uVar12 - uVar11 != uVar9);
          }
        }
      }
      uVar11 = uVar4;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar5);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}